

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_rightShiftVecScalar_ivec2(ShaderEvalContext *c)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = (uint)c->in[1].m_data[0];
  uVar1 = ~(0xffffffffU >> ((byte)uVar2 & 0x1f));
  iVar3 = (int)c->in[0].m_data[3];
  iVar4 = (int)c->in[0].m_data[1];
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(int)(uVar1 & -(uint)(iVar4 < 0) | iVar4 >> ZEXT416(uVar2)),
                (float)(int)(uVar1 & -(uint)(iVar3 < 0) | iVar3 >> ZEXT416(uVar2)));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }